

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PingPongServer.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  WrapTcpService *this;
  PTR listenThread;
  EventLoop mainLoop;
  undefined8 *local_158;
  undefined8 uStack_150;
  code *local_148;
  code *pcStack_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  code *local_118;
  undefined8 uStack_110;
  long *local_100 [2];
  long local_f0 [24];
  
  if (argc == 3) {
    puVar2 = (undefined8 *)operator_new(0x28);
    puVar2[1] = 0x100000001;
    *puVar2 = &PTR___Sp_counted_ptr_inplace_00106ca8;
    this = (WrapTcpService *)(puVar2 + 2);
    brynet::net::WrapTcpService::WrapTcpService(this);
    brynet::net::ListenThread::Create();
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"0.0.0.0","");
    iVar1 = atoi(argv[1]);
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(puVar2 + 1) = *(int *)(puVar2 + 1) + 1;
      UNLOCK();
    }
    else {
      *(int *)(puVar2 + 1) = *(int *)(puVar2 + 1) + 1;
    }
    local_148 = (code *)0x0;
    pcStack_140 = (code *)0x0;
    local_158 = (undefined8 *)0x0;
    uStack_150 = 0;
    local_158 = (undefined8 *)operator_new(0x10);
    *local_158 = this;
    local_158[1] = puVar2;
    pcStack_140 = std::
                  _Function_handler<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/examples/PingPongServer.cpp:29:64)>
                  ::_M_invoke;
    local_148 = std::
                _Function_handler<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/examples/PingPongServer.cpp:29:64)>
                ::_M_manager;
    brynet::net::ListenThread::startListen(local_138,0,local_100,iVar1);
    if (local_148 != (code *)0x0) {
      (*local_148)(&local_158,&local_158,3);
    }
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0] + 1);
    }
    iVar1 = atoi(argv[2]);
    local_128 = 0;
    uStack_120 = 0;
    local_118 = (code *)0x0;
    uStack_110 = 0;
    brynet::net::WrapTcpService::startWorkThread(this,(long)iVar1);
    if (local_118 != (code *)0x0) {
      (*local_118)(&local_128,&local_128,3);
    }
    brynet::net::EventLoop::EventLoop((EventLoop *)local_100);
    do {
      brynet::net::EventLoop::loop((long)local_100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"total recv : ",0xd);
      poVar3 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," M /s, of client num:",0x15);
      poVar3 = std::ostream::_M_insert<long_long>((longlong)poVar3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"packet num:",0xb);
      poVar3 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      LOCK();
      total_packet_num.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
      LOCK();
      TotalRecvSize.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
    } while( true );
  }
  fwrite("Usage: <listen port> <net work thread num>\n",0x2b,1,_stderr);
  exit(-1);
}

Assistant:

int main(int argc, char **argv)
{
    if (argc != 3)
    {
        fprintf(stderr, "Usage: <listen port> <net work thread num>\n");
        exit(-1);
    }

    auto server = std::make_shared<WrapTcpService>();
    auto listenThread = ListenThread::Create();

    listenThread->startListen(false, "0.0.0.0", atoi(argv[1]), [=](TcpSocket::PTR socket){
        socket->SocketNodelay();

        auto enterCallback = [](const TCPSession::PTR& session) {
            total_client_num++;

            session->setDataCallback([](const TCPSession::PTR& session, const char* buffer, size_t len) {
                session->send(buffer, len);
                TotalRecvSize += len;
                total_packet_num++;
                return len;
            });

            session->setDisConnectCallback([](const TCPSession::PTR& session) {
                total_client_num--;
            });
        };

        server->addSession(std::move(socket),
                AddSessionOption::WithEnterCallback(enterCallback),
                AddSessionOption::WithMaxRecvBufferSize(1024*1024));
    });

    server->startWorkThread(atoi(argv[2]));

    EventLoop mainLoop;
    while (true)
    {
        mainLoop.loop(1000);
        std::cout << "total recv : " << (TotalRecvSize / 1024) / 1024 << " M /s, of client num:" << total_client_num << std::endl;
        std::cout << "packet num:" << total_packet_num << std::endl;
        total_packet_num = 0;
        TotalRecvSize = 0;
    }
}